

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void FCanvasTextureInfo::Serialize(FSerializer *arc)

{
  AActor *pAVar1;
  FCanvasTextureInfo *pFVar2;
  bool bVar3;
  FSerializer *pFVar4;
  AActor *unaff_R15;
  FTextureID picnum;
  int fov;
  FTextureID local_40;
  int local_3c;
  AActor *local_38;
  
  if (arc->w == (FWriter *)0x0) {
    bVar3 = FSerializer::BeginArray(arc,"canvastextures");
    if (bVar3) {
      bVar3 = FSerializer::BeginObject(arc,(char *)0x0);
      if (bVar3) {
        do {
          local_38 = unaff_R15;
          ::Serialize(arc,"viewpoint",(DObject **)&local_38,(DObject **)0x0,(bool *)0x0);
          pFVar4 = ::Serialize(arc,"fov",&local_3c,(int32_t *)0x0);
          pFVar4 = ::Serialize(pFVar4,"texture",&local_40,(FTextureID *)0x0);
          FSerializer::EndObject(pFVar4);
          Add(local_38,local_40,local_3c);
          bVar3 = FSerializer::BeginObject(arc,(char *)0x0);
          unaff_R15 = local_38;
        } while (bVar3);
      }
      FSerializer::EndArray(arc);
    }
  }
  else if ((List != (FCanvasTextureInfo *)0x0) &&
          (bVar3 = FSerializer::BeginArray(arc,"canvastextures"), pFVar2 = List, bVar3)) {
    for (; pFVar2 != (FCanvasTextureInfo *)0x0; pFVar2 = pFVar2->Next) {
      if ((pFVar2->Texture != (FCanvasTexture *)0x0) &&
         (pAVar1 = (pFVar2->Viewpoint).field_0.p, pAVar1 != (AActor *)0x0)) {
        if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          bVar3 = FSerializer::BeginObject(arc,(char *)0x0);
          if (bVar3) {
            ::Serialize(arc,"viewpoint",(DObject **)&pFVar2->Viewpoint,(DObject **)0x0,(bool *)0x0);
            pFVar4 = ::Serialize(arc,"fov",&pFVar2->FOV,(int32_t *)0x0);
            pFVar4 = ::Serialize(pFVar4,"texture",&pFVar2->PicNum,(FTextureID *)0x0);
            FSerializer::EndObject(pFVar4);
          }
        }
        else {
          (pFVar2->Viewpoint).field_0.p = (AActor *)0x0;
        }
      }
    }
    FSerializer::EndArray(arc);
    return;
  }
  return;
}

Assistant:

void FCanvasTextureInfo::Serialize(FSerializer &arc)
{
	if (arc.isWriting())
	{
		if (List != nullptr)
		{
			if (arc.BeginArray("canvastextures"))
			{
				FCanvasTextureInfo *probe;

				for (probe = List; probe != nullptr; probe = probe->Next)
				{
					if (probe->Texture != nullptr && probe->Viewpoint != nullptr)
					{
						if (arc.BeginObject(nullptr))
						{
							arc("viewpoint", probe->Viewpoint)
								("fov", probe->FOV)
								("texture", probe->PicNum)
								.EndObject();
						}
					}
				}
				arc.EndArray();
			}
		}
	}
	else
	{
		if (arc.BeginArray("canvastextures"))
		{
			AActor *viewpoint;
			int fov;
			FTextureID picnum;
			while (arc.BeginObject(nullptr))
			{
				arc("viewpoint", viewpoint)
					("fov", fov)
					("texture", picnum)
					.EndObject();
				Add(viewpoint, picnum, fov);
			}
			arc.EndArray();
		}
	}
}